

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::get<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location,error_code *ec)

{
  bool bVar1;
  reference this;
  string_view_type *in_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  error_code *in_RDI;
  iterator end;
  iterator it;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_ffffffffffffffa8;
  error_code *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  error_code *ec_00;
  error_code *local_8;
  
  bVar1 = basic_json_pointer<char>::empty((basic_json_pointer<char> *)0x5419dd);
  local_8 = in_RDI;
  if (!bVar1) {
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         basic_json_pointer<char>::begin_abi_cxx11_(in_stack_ffffffffffffffa8);
    basic_json_pointer<char>::end_abi_cxx11_(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffffa8), in_stack_ffffffffffffffb0 = in_RDI,
          local_8 = in_stack_ffffffffffffffb0, bVar1) {
      ec_00 = in_stack_ffffffffffffffb0;
      this = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      in_RDI = (error_code *)
               detail::
               resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         (in_RSI,in_RDX,ec_00);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
      if (bVar1) {
        return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    }
  }
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_8;
}

Assistant:

const Json& get(const Json& root, 
                    const basic_json_pointer<typename Json::char_type>& location, 
                    std::error_code& ec)
    {
        if (location.empty())
        {
            return root;
        }

        const Json* current = std::addressof(root);
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            current = jsoncons::jsonpointer::detail::resolve(current, *it, ec);
            if (JSONCONS_UNLIKELY(ec))
                return *current;
            ++it;
        }
        return *current;
    }